

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRPluginManager.cpp
# Opt level: O3

void __thiscall MinVR::VRPluginManager::~VRPluginManager(VRPluginManager *this)

{
  VRSharedLibrary *pVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  ulong uVar5;
  
  this->_vptr_VRPluginManager = (version_t **)&PTR__VRPluginManager_00176980;
  ppVVar2 = (this->_plugins).
            super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_plugins).super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVVar2) {
    uVar5 = 0;
    do {
      (**(code **)(*(long *)ppVVar2[uVar5] + 0x18))(ppVVar2[uVar5],this->_vrMain);
      ppVVar2 = (this->_plugins).
                super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppVVar2[uVar5] != (VRPlugin *)0x0) {
        (**(code **)(*(long *)ppVVar2[uVar5] + 8))();
        ppVVar2 = (this->_plugins).
                  super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->_plugins).
                                   super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2 >> 3))
    ;
  }
  ppVVar4 = (this->_libraries).
            super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar3 = (this->_libraries).
            super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar3 != ppVVar4) {
    uVar5 = 0;
    do {
      pVVar1 = ppVVar4[uVar5];
      if (pVVar1 != (VRSharedLibrary *)0x0) {
        (*pVVar1->_vptr_VRSharedLibrary[1])(pVVar1);
        ppVVar4 = (this->_libraries).
                  super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVVar3 = (this->_libraries).
                  super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppVVar3 - (long)ppVVar4 >> 3));
  }
  if (ppVVar4 != (pointer)0x0) {
    operator_delete(ppVVar4,(long)(this->_libraries).
                                  super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar4
                   );
  }
  ppVVar2 = (this->_plugins).
            super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2,(long)(this->_plugins).
                                  super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar2
                   );
    return;
  }
  return;
}

Assistant:

VRPluginManager::~VRPluginManager() {
	for (size_t f = 0; f < _plugins.size(); f++)
	{
		_plugins[f]->unregisterWithMinVR(_vrMain);
		delete _plugins[f];
	}

	for (size_t f = 0; f < _libraries.size(); f++)
	{
		delete _libraries[f];
	}
}